

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend_tests.cpp
# Opt level: O1

void __thiscall
wallet::spend_tests::wallet_duplicated_preset_inputs_test::test_method
          (wallet_duplicated_preset_inputs_test *this)

{
  _Rb_tree_header *p_Var1;
  Chain *chain;
  undefined1 auVar2 [16];
  string label;
  uint256 *puVar3;
  base_blob<256U> *pbVar4;
  _Head_base<0UL,_wallet::CWallet_*,_false> this_00;
  Chainstate *pCVar5;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *this_01;
  T *__rhs;
  _Base_ptr p_Var6;
  CCoinControl *coinControl;
  int iVar7;
  char *pcVar8;
  iterator pvVar9;
  RecursiveMutex **ppRVar10;
  iterator pvVar11;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<wallet::CRecipient> __l_00;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> recipients;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> coins;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  CCoinControl coin_control;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> preset_inputs;
  CoinsResult available_coins;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  check_type cVar12;
  undefined8 in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffb60;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  lazy_ostream local_460;
  undefined1 *local_450;
  char **local_448;
  assertion_result local_440;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> local_408;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> local_3f0;
  _Head_base<0UL,_wallet::CWallet_*,_false> local_3d8;
  unique_lock<std::recursive_mutex> local_3d0;
  _Variadic_union<bilingual_str,_wallet::CreatedTransactionResult> local_3c0;
  char local_320;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_318;
  undefined8 local_2d0;
  _Optional_payload_base<OutputType> _Stack_2c8;
  bool local_2c0;
  bool bStack_2bf;
  undefined6 uStack_2be;
  _Storage<CFeeRate,_true> _Stack_2b8;
  uint32_t local_2b0;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_288;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_258;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_228;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_1f8;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_1c8;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  local_180;
  long *local_148 [2];
  long local_138 [2];
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  local_128;
  undefined1 local_f8 [16];
  pointer local_e8;
  CBlock local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  coinControl = (CCoinControl *)&(this->super_TestChain100Setup).coinbaseKey;
  iVar7 = 4;
  do {
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_e8 = (pointer)0x0;
    CKey::GetPubKey((CPubKey *)&local_318,(CKey *)coinControl);
    GetScriptForRawPubKey((CScript *)&local_3c0._M_first,(CPubKey *)&local_318);
    TestChain100Setup::CreateAndProcessBlock
              (&local_a8,&this->super_TestChain100Setup,
               (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_f8,
               (CScript *)&local_3c0._M_first,(Chainstate *)0x0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_a8.vtx);
    if (0x1c < (uint)local_3c0._28_4_) {
      free((void *)local_3c0._0_8_);
      local_3c0._0_8_ = (void *)0x0;
    }
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_f8);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  chain = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
          super_BasicTestingSetup.m_node.chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/spend_tests.cpp"
             ,0x46,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/spend_tests.cpp"
             ,0x46,"operator()","m_node.chainman");
  local_318._0_8_ = &cs_main;
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_318);
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_318);
  CreateSyncedWallet((wallet *)&local_3d8,chain,&pCVar5->m_chain,(CKey *)coinControl);
  local_3d0._M_device = &((local_3d8._M_head_impl)->cs_wallet).super_recursive_mutex;
  local_3d0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_3d0);
  ppRVar10 = (RecursiveMutex **)&local_318;
  local_318._0_8_ = (mutex_type *)0x1;
  local_318._8_8_ = 2100000000000000;
  local_318._M_first._M_storage._M_storage[0x10] = '\0';
  local_318._M_first._M_storage._M_storage[0x11] = '@';
  local_318._M_first._M_storage._M_storage[0x12] = '\a';
  local_318._M_first._M_storage._M_storage[0x13] = 'Z';
  local_318._M_first._M_storage._M_storage[0x14] = 0xf0;
  local_318._M_first._M_storage._M_storage[0x15] = 'u';
  local_318._M_first._M_storage._M_storage[0x16] = '\a';
  local_318._M_first._M_storage._M_storage[0x17] = '\0';
  local_318._M_first._M_storage._M_storage[0x18] = '\0';
  local_318._M_first._M_storage._M_storage[0x19] = '\0';
  local_318._M_first._M_storage._M_storage[0x1a] = '\0';
  local_318._M_first._M_storage._M_storage[0x1b] = '\0';
  local_318._M_first._M_storage._M_storage[0x1c] = '\0';
  local_318._M_first._M_storage._M_storage[0x1d] = '\0';
  local_318._M_first._M_storage._M_storage[0x1e] = '\0';
  local_318._M_first._M_storage._M_storage[0x1f] = '\0';
  local_318._32_3_ = 0x10001;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ppRVar10;
  AvailableCoins((CoinsResult *)local_f8,(wallet *)local_3d8._M_head_impl,(CWallet *)0x0,coinControl
                 ,(optional<CFeeRate>)(auVar2 << 0x40),
                 (CoinFilterParams *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  CoinsResult::All(&local_3f0,(CoinsResult *)local_f8);
  local_318._32_4_ =
       ((local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
         super__Vector_impl_data._M_start)->outpoint).n;
  local_318._0_8_ =
       *(undefined8 *)
        ((local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
          super__Vector_impl_data._M_start)->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems;
  pbVar4 = &((local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
              _M_impl.super__Vector_impl_data._M_start)->outpoint).hash.m_wrapped.
            super_base_blob<256U>;
  local_318._8_1_ = (bool)(pbVar4->m_data)._M_elems[8];
  local_318._9_1_ = (pbVar4->m_data)._M_elems[9];
  local_318._10_1_ = (pbVar4->m_data)._M_elems[10];
  local_318._11_1_ = (pbVar4->m_data)._M_elems[0xb];
  local_318._12_1_ = (pbVar4->m_data)._M_elems[0xc];
  local_318._13_1_ = (pbVar4->m_data)._M_elems[0xd];
  local_318._14_1_ = (pbVar4->m_data)._M_elems[0xe];
  local_318._15_1_ = (pbVar4->m_data)._M_elems[0xf];
  local_318._16_8_ =
       *(undefined8 *)
        (((local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
           super__Vector_impl_data._M_start)->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data.
         _M_elems + 0x10);
  local_318._24_8_ =
       *(undefined8 *)
        (((local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
           super__Vector_impl_data._M_start)->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data.
         _M_elems + 0x18);
  local_318._36_8_ =
       *(undefined8 *)
        local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
        super__Vector_impl_data._M_start[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems;
  local_318._44_8_ =
       *(undefined8 *)
        (local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
         super__Vector_impl_data._M_start[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data.
         _M_elems + 8);
  local_318._52_8_ =
       *(undefined8 *)
        (local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
         super__Vector_impl_data._M_start[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data.
         _M_elems + 0x10);
  local_318._60_8_ =
       *(undefined8 *)
        (local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
         super__Vector_impl_data._M_start[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data.
         _M_elems + 0x18);
  local_318._68_4_ =
       local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
       super__Vector_impl_data._M_start[1].outpoint.n;
  puVar3 = &local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
            super__Vector_impl_data._M_start[2].outpoint.hash.m_wrapped;
  local_2d0._0_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[0];
  local_2d0._1_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[1];
  local_2d0._2_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[2];
  local_2d0._3_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[3];
  local_2d0._4_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[4];
  local_2d0._5_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[5];
  local_2d0._6_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[6];
  local_2d0._7_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[7];
  _Stack_2c8 = *(_Optional_payload_base<OutputType> *)
                (local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                 _M_impl.super__Vector_impl_data._M_start[2].outpoint.hash.m_wrapped.
                 super_base_blob<256U>.m_data._M_elems + 8);
  pbVar4 = &local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
            super__Vector_impl_data._M_start[2].outpoint.hash.m_wrapped.super_base_blob<256U>;
  local_2c0 = (bool)(pbVar4->m_data)._M_elems[0x10];
  bStack_2bf = (bool)(pbVar4->m_data)._M_elems[0x11];
  unique0x1000065e = (bool)(pbVar4->m_data)._M_elems[0x12];
  unique0x1000065f = (bool)(pbVar4->m_data)._M_elems[0x13];
  unique0x10000660 = (pbVar4->m_data)._M_elems[0x14];
  unique0x10000661 = (pbVar4->m_data)._M_elems[0x15];
  unique0x10000662 = (pbVar4->m_data)._M_elems[0x16];
  unique0x10000663 = (pbVar4->m_data)._M_elems[0x17];
  _Stack_2b8 = *(_Storage<CFeeRate,_true> *)
                (local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                 _M_impl.super__Vector_impl_data._M_start[2].outpoint.hash.m_wrapped.
                 super_base_blob<256U>.m_data._M_elems + 0x18);
  local_2b0 = local_3f0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
              _M_impl.super__Vector_impl_data._M_start[2].outpoint.n;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_318;
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::set
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)&local_128,__l,
             (less<COutPoint> *)&local_3c0._M_first,(allocator_type *)&local_460);
  this_00._M_head_impl = local_3d8._M_head_impl;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"dummy","");
  label._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb4c;
  label._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
  label._M_string_length = (size_type)_cVar12;
  label.field_2._M_allocated_capacity = in_stack_fffffffffffffb58;
  label.field_2._8_8_ = in_stack_fffffffffffffb60;
  CWallet::GetNewDestination
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)&local_3c0._M_first,this_00._M_head_impl,BECH32,label);
  pcVar8 = "wallet->GetNewDestination(OutputType::BECH32, \"dummy\")";
  this_01 = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                      ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                        *)&local_3c0._M_first,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/spend_tests.cpp"
                       ,0x50,"test_method",
                       "wallet->GetNewDestination(OutputType::BECH32, \"dummy\")");
  __rhs = util::
          Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          ::value(this_01);
  std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&local_318,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)__rhs);
  _Stack_2c8._M_payload = (_Storage<OutputType,_true>)0xf62dcb00;
  _Stack_2c8._M_engaged = true;
  _Stack_2c8._5_3_ = 0;
  local_2c0 = true;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_318;
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::vector
            (&local_408,__l_00,(allocator_type *)&local_460);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_318);
  std::__detail::__variant::
  _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)&local_3c0._M_first);
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  CCoinControl::CCoinControl((CCoinControl *)&local_318);
  bStack_2bf = true;
  p_Var1 = &local_128._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_128._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var6 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      CCoinControl::Select((CCoinControl *)&local_318,(COutPoint *)(p_Var6 + 1));
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/spend_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x64;
  file.m_begin = (iterator)&local_418;
  msg.m_end = (iterator)ppRVar10;
  msg.m_begin = pcVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_428,msg);
  CreateTransaction((Result<wallet::CreatedTransactionResult> *)&local_3c0._M_first,
                    local_3d8._M_head_impl,&local_408,(optional<unsigned_int>)0x0,
                    (CCoinControl *)&local_318,true);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_320 != '\x01');
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "!CreateTransaction(*wallet, recipients, std::nullopt, coin_control)";
  local_468 = "";
  local_460.m_empty = false;
  local_460._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_450 = boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/spend_tests.cpp"
  ;
  local_478 = "";
  pvVar9 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_448 = &local_470;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,&local_460,1,0,WARN,_cVar12,(size_t)&local_480,100);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                      &local_3c0._M_first);
  (local_408.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>._M_impl.
   super__Vector_impl_data._M_start)->fSubtractFeeFromAmount = false;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/spend_tests.cpp"
  ;
  local_488 = "";
  file_00.m_end = &DAT_00000068;
  file_00.m_begin = (iterator)&local_490;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffb60,msg_00);
  CreateTransaction((Result<wallet::CreatedTransactionResult> *)&local_3c0._M_first,
                    local_3d8._M_head_impl,&local_408,(optional<unsigned_int>)0x0,
                    (CCoinControl *)&local_318,true);
  local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_320 != '\x01');
  local_440.m_message.px = (element_type *)0x0;
  local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_470 = "!CreateTransaction(*wallet, recipients, std::nullopt, coin_control)";
  local_468 = "";
  local_460.m_empty = false;
  local_460._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_450 = boost::unit_test::lazy_ostream::inst;
  local_448 = &local_470;
  boost::test_tools::tt_detail::report_assertion
            (&local_440,&local_460,1,0,WARN,0xfb1e46,(size_t)&stack0xfffffffffffffb50,0x68);
  boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                      &local_3c0._M_first);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::~_Rb_tree(&local_180);
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&local_1c8);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_1f8);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&local_228);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&local_258);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_288);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_318);
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::~vector(&local_408);
  std::
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  ::~_Rb_tree(&local_128);
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector(&local_3f0);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)local_f8);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_3d0);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)&local_3d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_duplicated_preset_inputs_test, TestChain100Setup)
{
    // Verify that the wallet's Coin Selection process does not include pre-selected inputs twice in a transaction.

    // Add 4 spendable UTXO, 50 BTC each, to the wallet (total balance 200 BTC)
    for (int i = 0; i < 4; i++) CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    auto wallet = CreateSyncedWallet(*m_node.chain, WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain()), coinbaseKey);

    LOCK(wallet->cs_wallet);
    auto available_coins = AvailableCoins(*wallet);
    std::vector<COutput> coins = available_coins.All();
    // Preselect the first 3 UTXO (150 BTC total)
    std::set<COutPoint> preset_inputs = {coins[0].outpoint, coins[1].outpoint, coins[2].outpoint};

    // Try to create a tx that spends more than what preset inputs + wallet selected inputs are covering for.
    // The wallet can cover up to 200 BTC, and the tx target is 299 BTC.
    std::vector<CRecipient> recipients{{*Assert(wallet->GetNewDestination(OutputType::BECH32, "dummy")),
                                           /*nAmount=*/299 * COIN, /*fSubtractFeeFromAmount=*/true}};
    CCoinControl coin_control;
    coin_control.m_allow_other_inputs = true;
    for (const auto& outpoint : preset_inputs) {
        coin_control.Select(outpoint);
    }

    // Attempt to send 299 BTC from a wallet that only has 200 BTC. The wallet should exclude
    // the preset inputs from the pool of available coins, realize that there is not enough
    // money to fund the 299 BTC payment, and fail with "Insufficient funds".
    //
    // Even with SFFO, the wallet can only afford to send 200 BTC.
    // If the wallet does not properly exclude preset inputs from the pool of available coins
    // prior to coin selection, it may create a transaction that does not fund the full payment
    // amount or, through SFFO, incorrectly reduce the recipient's amount by the difference
    // between the original target and the wrongly counted inputs (in this case 99 BTC)
    // so that the recipient's amount is no longer equal to the user's selected target of 299 BTC.

    // First case, use 'subtract_fee_from_outputs=true'
    BOOST_CHECK(!CreateTransaction(*wallet, recipients, /*change_pos=*/std::nullopt, coin_control));

    // Second case, don't use 'subtract_fee_from_outputs'.
    recipients[0].fSubtractFeeFromAmount = false;
    BOOST_CHECK(!CreateTransaction(*wallet, recipients, /*change_pos=*/std::nullopt, coin_control));
}